

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::auto_stack_update::auto_stack_update
          (auto_stack_update *this,impl *parent,source_extend *pos)

{
  source_extend *pos_local;
  impl *parent_local;
  auto_stack_update *this_local;
  
  this->parent_ = parent;
  source_extend::source_extend(&this->old_extend_,&parent->current_extend_);
  source_extend::source_extend(&this->pos_,pos);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::push_back
            (&this->parent_->stack_trace_,pos);
  return;
}

Assistant:

explicit auto_stack_update(impl& parent, const source_extend& pos)
            : parent_(parent)
            , old_extend_(parent.current_extend_)
#ifndef NDEBUG
            , pos_(pos)
#endif
        {
            parent_.stack_trace_.push_back(pos);
        }